

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

xmlElementContentPtr
xmlParseElementChildrenContentDeclPriv(xmlParserCtxtPtr ctxt,int inputchk,int depth)

{
  byte bVar1;
  xmlChar xVar2;
  _xmlElementContent *p_Var3;
  xmlElementContentPtr cur;
  xmlElementContentPtr pxVar4;
  xmlParserInputPtr pxVar5;
  xmlElementContentPtr cur_00;
  xmlChar *pxVar6;
  _xmlElementContent *p_Var7;
  int iVar8;
  uint val;
  long lVar9;
  byte bVar10;
  bool bVar11;
  
  iVar8 = 0x800;
  if ((ctxt->options & 0x80000) == 0) {
    iVar8 = 0x100;
  }
  if (iVar8 < depth) {
    xmlFatalErrMsgInt(ctxt,XML_ERR_RESOURCE_LIMIT,
                      "xmlParseElementChildrenContentDecl : depth %d too deep, use XML_PARSE_HUGE\n"
                      ,depth);
    return (xmlElementContentPtr)0x0;
  }
  xmlSkipBlankCharsPE(ctxt);
  pxVar5 = ctxt->input;
  if (((pxVar5->flags & 0x40) == 0) && ((long)pxVar5->end - (long)pxVar5->cur < 0xfa)) {
    xmlParserGrow(ctxt);
    pxVar5 = ctxt->input;
  }
  if (*pxVar5->cur == '(') {
    iVar8 = pxVar5->id;
    xmlNextChar(ctxt);
    xmlSkipBlankCharsPE(ctxt);
    cur = xmlParseElementChildrenContentDeclPriv(ctxt,iVar8,depth + 1);
    if (cur == (xmlElementContentPtr)0x0) {
      return (xmlElementContentPtr)0x0;
    }
    xmlSkipBlankCharsPE(ctxt);
    pxVar5 = ctxt->input;
    if ((pxVar5->flags & 0x40) != 0) goto LAB_00135830;
    lVar9 = (long)pxVar5->end - (long)pxVar5->cur;
  }
  else {
    pxVar6 = xmlParseName(ctxt);
    if (pxVar6 == (xmlChar *)0x0) {
      xmlFatalErr(ctxt,XML_ERR_ELEMCONTENT_NOT_STARTED,(char *)0x0);
      return (xmlElementContentPtr)0x0;
    }
    cur = xmlNewDocElementContent(ctxt->myDoc,pxVar6,XML_ELEMENT_CONTENT_ELEMENT);
    if (cur == (xmlElementContentPtr)0x0) {
      xmlCtxtErrMemory(ctxt);
      return (xmlElementContentPtr)0x0;
    }
    pxVar5 = ctxt->input;
    if (((pxVar5->flags & 0x40) == 0) && ((long)pxVar5->end - (long)pxVar5->cur < 0xfa)) {
      xmlParserGrow(ctxt);
      pxVar5 = ctxt->input;
    }
    xVar2 = *pxVar5->cur;
    if (xVar2 == '*') {
      cur->ocur = XML_ELEMENT_CONTENT_MULT;
LAB_001357f6:
      xmlNextChar(ctxt);
    }
    else {
      if (xVar2 == '+') {
        cur->ocur = XML_ELEMENT_CONTENT_PLUS;
        goto LAB_001357f6;
      }
      if (xVar2 == '?') {
        cur->ocur = XML_ELEMENT_CONTENT_OPT;
        goto LAB_001357f6;
      }
      cur->ocur = XML_ELEMENT_CONTENT_ONCE;
    }
    pxVar5 = ctxt->input;
    if ((pxVar5->flags & 0x40) != 0) goto LAB_00135830;
    lVar9 = (long)pxVar5->end - (long)pxVar5->cur;
  }
  if (lVar9 < 0xfa) {
    xmlParserGrow(ctxt);
  }
LAB_00135830:
  xmlSkipBlankCharsPE(ctxt);
  cur_00 = (xmlElementContentPtr)0x0;
  p_Var7 = cur;
  bVar10 = 0;
  do {
    pxVar5 = ctxt->input;
    bVar1 = *pxVar5->cur;
    if ((bVar1 == 0x29) || (1 < ctxt->disableSAX)) {
      if (cur_00 != (xmlElementContentPtr)0x0) {
        p_Var7->c2 = cur_00;
        cur_00->parent = p_Var7;
      }
      if (pxVar5->id != inputchk) {
        xmlFatalErrMsg(ctxt,XML_ERR_ENTITY_BOUNDARY,
                       "Element content declaration doesn\'t start and stop in the same entity\n");
      }
      xmlNextChar(ctxt);
      xVar2 = *ctxt->input->cur;
      if (xVar2 == '*') {
        if (cur != (xmlElementContentPtr)0x0) {
          cur->ocur = XML_ELEMENT_CONTENT_MULT;
          p_Var7 = cur;
          while ((p_Var7 != (xmlElementContentPtr)0x0 && (p_Var7->type == XML_ELEMENT_CONTENT_OR)))
          {
            p_Var3 = p_Var7->c1;
            if ((p_Var3 != (_xmlElementContent *)0x0) &&
               ((p_Var3->ocur & ~XML_ELEMENT_CONTENT_ONCE) == XML_ELEMENT_CONTENT_OPT)) {
              p_Var3->ocur = XML_ELEMENT_CONTENT_ONCE;
            }
            p_Var7 = p_Var7->c2;
            if ((p_Var7 != (_xmlElementContent *)0x0) &&
               ((p_Var7->ocur & ~XML_ELEMENT_CONTENT_ONCE) == XML_ELEMENT_CONTENT_OPT)) {
              p_Var7->ocur = XML_ELEMENT_CONTENT_ONCE;
            }
          }
        }
      }
      else if (xVar2 == '+') {
        if (cur != (xmlElementContentPtr)0x0) {
          cur->ocur = ((cur->ocur & ~XML_ELEMENT_CONTENT_ONCE) != XML_ELEMENT_CONTENT_OPT) +
                      XML_ELEMENT_CONTENT_MULT;
          bVar11 = false;
          while ((p_Var7 != (xmlElementContentPtr)0x0 && (p_Var7->type == XML_ELEMENT_CONTENT_OR)))
          {
            p_Var3 = p_Var7->c1;
            if ((p_Var3 != (_xmlElementContent *)0x0) &&
               ((p_Var3->ocur & ~XML_ELEMENT_CONTENT_ONCE) == XML_ELEMENT_CONTENT_OPT)) {
              p_Var3->ocur = XML_ELEMENT_CONTENT_ONCE;
              bVar11 = true;
            }
            p_Var7 = p_Var7->c2;
            if ((p_Var7 != (_xmlElementContent *)0x0) &&
               ((p_Var7->ocur & ~XML_ELEMENT_CONTENT_ONCE) == XML_ELEMENT_CONTENT_OPT)) {
              p_Var7->ocur = XML_ELEMENT_CONTENT_ONCE;
              bVar11 = true;
            }
          }
          if (bVar11) {
            cur->ocur = XML_ELEMENT_CONTENT_MULT;
          }
        }
      }
      else {
        if (xVar2 != '?') {
          return cur;
        }
        if (cur != (xmlElementContentPtr)0x0) {
          cur->ocur = (cur->ocur - XML_ELEMENT_CONTENT_MULT < 2) + XML_ELEMENT_CONTENT_OPT;
        }
      }
      xmlNextChar(ctxt);
      return cur;
    }
    val = (uint)bVar10;
    if (bVar1 != 0x7c) {
      if (bVar1 == 0x2c) {
        if ((bVar10 == 0) || (val == 0x2c)) {
          xmlNextChar(ctxt);
          pxVar4 = xmlNewDocElementContent(ctxt->myDoc,(xmlChar *)0x0,XML_ELEMENT_CONTENT_SEQ);
          if (pxVar4 == (xmlElementContentPtr)0x0) {
            xmlCtxtErrMemory(ctxt);
            if ((cur_00 != (xmlElementContentPtr)0x0) && (cur_00 != cur)) {
              xmlFreeDocElementContent(ctxt->myDoc,cur_00);
            }
            goto LAB_00135c16;
          }
          goto LAB_001358d0;
        }
        goto LAB_00135b97;
      }
      xmlFatalErr(ctxt,XML_ERR_ELEMCONTENT_NOT_FINISHED,(char *)0x0);
LAB_00135bb3:
      if ((cur_00 != (xmlElementContentPtr)0x0) && (cur_00 != cur)) {
        xmlFreeDocElementContent(ctxt->myDoc,cur_00);
      }
LAB_00135c0d:
      if (cur == (xmlElementContentPtr)0x0) {
        return (xmlElementContentPtr)0x0;
      }
LAB_00135c16:
      xmlFreeDocElementContent(ctxt->myDoc,cur);
      return (xmlElementContentPtr)0x0;
    }
    if ((bVar10 != 0) && (val != 0x7c)) {
LAB_00135b97:
      xmlFatalErrMsgInt(ctxt,XML_ERR_SEPARATOR_REQUIRED,
                        "xmlParseElementChildrenContentDecl : \'%c\' expected\n",val);
      goto LAB_00135bb3;
    }
    xmlNextChar(ctxt);
    pxVar4 = xmlNewDocElementContent(ctxt->myDoc,(xmlChar *)0x0,XML_ELEMENT_CONTENT_OR);
    if (pxVar4 == (xmlElementContentPtr)0x0) {
      xmlCtxtErrMemory(ctxt);
      goto LAB_00135bb3;
    }
LAB_001358d0:
    if (cur_00 == (xmlElementContentPtr)0x0) {
      pxVar4->c1 = cur;
      bVar11 = cur != (xmlElementContentPtr)0x0;
      cur_00 = cur;
      cur = pxVar4;
      if (bVar11) goto LAB_001358f6;
    }
    else {
      p_Var7->c2 = pxVar4;
      pxVar4->parent = p_Var7;
      pxVar4->c1 = cur_00;
LAB_001358f6:
      cur_00->parent = pxVar4;
    }
    pxVar5 = ctxt->input;
    if (((pxVar5->flags & 0x40) == 0) && ((long)pxVar5->end - (long)pxVar5->cur < 0xfa)) {
      xmlParserGrow(ctxt);
    }
    xmlSkipBlankCharsPE(ctxt);
    pxVar5 = ctxt->input;
    if (((pxVar5->flags & 0x40) == 0) && ((long)pxVar5->end - (long)pxVar5->cur < 0xfa)) {
      xmlParserGrow(ctxt);
      pxVar5 = ctxt->input;
    }
    if (*pxVar5->cur == '(') {
      iVar8 = pxVar5->id;
      xmlNextChar(ctxt);
      xmlSkipBlankCharsPE(ctxt);
      cur_00 = xmlParseElementChildrenContentDeclPriv(ctxt,iVar8,depth + 1);
      if (cur_00 != (xmlElementContentPtr)0x0) {
        xmlSkipBlankCharsPE(ctxt);
        goto LAB_00135a04;
      }
      goto LAB_00135c0d;
    }
    pxVar6 = xmlParseName(ctxt);
    if (pxVar6 == (xmlChar *)0x0) {
      xmlFatalErr(ctxt,XML_ERR_ELEMCONTENT_NOT_STARTED,(char *)0x0);
      if (cur == (xmlElementContentPtr)0x0) {
        return (xmlElementContentPtr)0x0;
      }
      goto LAB_00135c16;
    }
    cur_00 = xmlNewDocElementContent(ctxt->myDoc,pxVar6,XML_ELEMENT_CONTENT_ELEMENT);
    if (cur_00 == (xmlElementContentPtr)0x0) {
      xmlCtxtErrMemory(ctxt);
      goto LAB_00135c0d;
    }
    xVar2 = *ctxt->input->cur;
    if (xVar2 == '*') {
      cur_00->ocur = XML_ELEMENT_CONTENT_MULT;
    }
    else if (xVar2 == '+') {
      cur_00->ocur = XML_ELEMENT_CONTENT_PLUS;
    }
    else {
      if (xVar2 != '?') {
        cur_00->ocur = XML_ELEMENT_CONTENT_ONCE;
        goto LAB_00135a04;
      }
      cur_00->ocur = XML_ELEMENT_CONTENT_OPT;
    }
    xmlNextChar(ctxt);
LAB_00135a04:
    xmlSkipBlankCharsPE(ctxt);
    pxVar5 = ctxt->input;
    p_Var7 = pxVar4;
    bVar10 = bVar1;
    if (((pxVar5->flags & 0x40) == 0) && ((long)pxVar5->end - (long)pxVar5->cur < 0xfa)) {
      xmlParserGrow(ctxt);
    }
  } while( true );
}

Assistant:

static xmlElementContentPtr
xmlParseElementChildrenContentDeclPriv(xmlParserCtxtPtr ctxt, int inputchk,
                                       int depth) {
    int maxDepth = (ctxt->options & XML_PARSE_HUGE) ? 2048 : 256;
    xmlElementContentPtr ret = NULL, cur = NULL, last = NULL, op = NULL;
    const xmlChar *elem;
    xmlChar type = 0;

    if (depth > maxDepth) {
        xmlFatalErrMsgInt(ctxt, XML_ERR_RESOURCE_LIMIT,
                "xmlParseElementChildrenContentDecl : depth %d too deep, "
                "use XML_PARSE_HUGE\n", depth);
	return(NULL);
    }
    SKIP_BLANKS_PE;
    GROW;
    if (RAW == '(') {
	int inputid = ctxt->input->id;

        /* Recurse on first child */
	NEXT;
	SKIP_BLANKS_PE;
        cur = ret = xmlParseElementChildrenContentDeclPriv(ctxt, inputid,
                                                           depth + 1);
        if (cur == NULL)
            return(NULL);
	SKIP_BLANKS_PE;
	GROW;
    } else {
	elem = xmlParseName(ctxt);
	if (elem == NULL) {
	    xmlFatalErr(ctxt, XML_ERR_ELEMCONTENT_NOT_STARTED, NULL);
	    return(NULL);
	}
        cur = ret = xmlNewDocElementContent(ctxt->myDoc, elem, XML_ELEMENT_CONTENT_ELEMENT);
	if (cur == NULL) {
	    xmlErrMemory(ctxt);
	    return(NULL);
	}
	GROW;
	if (RAW == '?') {
	    cur->ocur = XML_ELEMENT_CONTENT_OPT;
	    NEXT;
	} else if (RAW == '*') {
	    cur->ocur = XML_ELEMENT_CONTENT_MULT;
	    NEXT;
	} else if (RAW == '+') {
	    cur->ocur = XML_ELEMENT_CONTENT_PLUS;
	    NEXT;
	} else {
	    cur->ocur = XML_ELEMENT_CONTENT_ONCE;
	}
	GROW;
    }
    SKIP_BLANKS_PE;
    while ((RAW != ')') && (PARSER_STOPPED(ctxt) == 0)) {
        /*
	 * Each loop we parse one separator and one element.
	 */
        if (RAW == ',') {
	    if (type == 0) type = CUR;

	    /*
	     * Detect "Name | Name , Name" error
	     */
	    else if (type != CUR) {
		xmlFatalErrMsgInt(ctxt, XML_ERR_SEPARATOR_REQUIRED,
		    "xmlParseElementChildrenContentDecl : '%c' expected\n",
		                  type);
		if ((last != NULL) && (last != ret))
		    xmlFreeDocElementContent(ctxt->myDoc, last);
		if (ret != NULL)
		    xmlFreeDocElementContent(ctxt->myDoc, ret);
		return(NULL);
	    }
	    NEXT;

	    op = xmlNewDocElementContent(ctxt->myDoc, NULL, XML_ELEMENT_CONTENT_SEQ);
	    if (op == NULL) {
                xmlErrMemory(ctxt);
		if ((last != NULL) && (last != ret))
		    xmlFreeDocElementContent(ctxt->myDoc, last);
	        xmlFreeDocElementContent(ctxt->myDoc, ret);
		return(NULL);
	    }
	    if (last == NULL) {
		op->c1 = ret;
		if (ret != NULL)
		    ret->parent = op;
		ret = cur = op;
	    } else {
	        cur->c2 = op;
		if (op != NULL)
		    op->parent = cur;
		op->c1 = last;
		if (last != NULL)
		    last->parent = op;
		cur =op;
		last = NULL;
	    }
	} else if (RAW == '|') {
	    if (type == 0) type = CUR;

	    /*
	     * Detect "Name , Name | Name" error
	     */
	    else if (type != CUR) {
		xmlFatalErrMsgInt(ctxt, XML_ERR_SEPARATOR_REQUIRED,
		    "xmlParseElementChildrenContentDecl : '%c' expected\n",
				  type);
		if ((last != NULL) && (last != ret))
		    xmlFreeDocElementContent(ctxt->myDoc, last);
		if (ret != NULL)
		    xmlFreeDocElementContent(ctxt->myDoc, ret);
		return(NULL);
	    }
	    NEXT;

	    op = xmlNewDocElementContent(ctxt->myDoc, NULL, XML_ELEMENT_CONTENT_OR);
	    if (op == NULL) {
                xmlErrMemory(ctxt);
		if ((last != NULL) && (last != ret))
		    xmlFreeDocElementContent(ctxt->myDoc, last);
		if (ret != NULL)
		    xmlFreeDocElementContent(ctxt->myDoc, ret);
		return(NULL);
	    }
	    if (last == NULL) {
		op->c1 = ret;
		if (ret != NULL)
		    ret->parent = op;
		ret = cur = op;
	    } else {
	        cur->c2 = op;
		if (op != NULL)
		    op->parent = cur;
		op->c1 = last;
		if (last != NULL)
		    last->parent = op;
		cur =op;
		last = NULL;
	    }
	} else {
	    xmlFatalErr(ctxt, XML_ERR_ELEMCONTENT_NOT_FINISHED, NULL);
	    if ((last != NULL) && (last != ret))
	        xmlFreeDocElementContent(ctxt->myDoc, last);
	    if (ret != NULL)
		xmlFreeDocElementContent(ctxt->myDoc, ret);
	    return(NULL);
	}
	GROW;
	SKIP_BLANKS_PE;
	GROW;
	if (RAW == '(') {
	    int inputid = ctxt->input->id;
	    /* Recurse on second child */
	    NEXT;
	    SKIP_BLANKS_PE;
	    last = xmlParseElementChildrenContentDeclPriv(ctxt, inputid,
                                                          depth + 1);
            if (last == NULL) {
		if (ret != NULL)
		    xmlFreeDocElementContent(ctxt->myDoc, ret);
		return(NULL);
            }
	    SKIP_BLANKS_PE;
	} else {
	    elem = xmlParseName(ctxt);
	    if (elem == NULL) {
		xmlFatalErr(ctxt, XML_ERR_ELEMCONTENT_NOT_STARTED, NULL);
		if (ret != NULL)
		    xmlFreeDocElementContent(ctxt->myDoc, ret);
		return(NULL);
	    }
	    last = xmlNewDocElementContent(ctxt->myDoc, elem, XML_ELEMENT_CONTENT_ELEMENT);
	    if (last == NULL) {
                xmlErrMemory(ctxt);
		if (ret != NULL)
		    xmlFreeDocElementContent(ctxt->myDoc, ret);
		return(NULL);
	    }
	    if (RAW == '?') {
		last->ocur = XML_ELEMENT_CONTENT_OPT;
		NEXT;
	    } else if (RAW == '*') {
		last->ocur = XML_ELEMENT_CONTENT_MULT;
		NEXT;
	    } else if (RAW == '+') {
		last->ocur = XML_ELEMENT_CONTENT_PLUS;
		NEXT;
	    } else {
		last->ocur = XML_ELEMENT_CONTENT_ONCE;
	    }
	}
	SKIP_BLANKS_PE;
	GROW;
    }
    if ((cur != NULL) && (last != NULL)) {
        cur->c2 = last;
	if (last != NULL)
	    last->parent = cur;
    }
    if (ctxt->input->id != inputchk) {
	xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
                       "Element content declaration doesn't start and stop in"
                       " the same entity\n");
    }
    NEXT;
    if (RAW == '?') {
	if (ret != NULL) {
	    if ((ret->ocur == XML_ELEMENT_CONTENT_PLUS) ||
	        (ret->ocur == XML_ELEMENT_CONTENT_MULT))
	        ret->ocur = XML_ELEMENT_CONTENT_MULT;
	    else
	        ret->ocur = XML_ELEMENT_CONTENT_OPT;
	}
	NEXT;
    } else if (RAW == '*') {
	if (ret != NULL) {
	    ret->ocur = XML_ELEMENT_CONTENT_MULT;
	    cur = ret;
	    /*
	     * Some normalization:
	     * (a | b* | c?)* == (a | b | c)*
	     */
	    while ((cur != NULL) && (cur->type == XML_ELEMENT_CONTENT_OR)) {
		if ((cur->c1 != NULL) &&
	            ((cur->c1->ocur == XML_ELEMENT_CONTENT_OPT) ||
		     (cur->c1->ocur == XML_ELEMENT_CONTENT_MULT)))
		    cur->c1->ocur = XML_ELEMENT_CONTENT_ONCE;
		if ((cur->c2 != NULL) &&
	            ((cur->c2->ocur == XML_ELEMENT_CONTENT_OPT) ||
		     (cur->c2->ocur == XML_ELEMENT_CONTENT_MULT)))
		    cur->c2->ocur = XML_ELEMENT_CONTENT_ONCE;
		cur = cur->c2;
	    }
	}
	NEXT;
    } else if (RAW == '+') {
	if (ret != NULL) {
	    int found = 0;

	    if ((ret->ocur == XML_ELEMENT_CONTENT_OPT) ||
	        (ret->ocur == XML_ELEMENT_CONTENT_MULT))
	        ret->ocur = XML_ELEMENT_CONTENT_MULT;
	    else
	        ret->ocur = XML_ELEMENT_CONTENT_PLUS;
	    /*
	     * Some normalization:
	     * (a | b*)+ == (a | b)*
	     * (a | b?)+ == (a | b)*
	     */
	    while ((cur != NULL) && (cur->type == XML_ELEMENT_CONTENT_OR)) {
		if ((cur->c1 != NULL) &&
	            ((cur->c1->ocur == XML_ELEMENT_CONTENT_OPT) ||
		     (cur->c1->ocur == XML_ELEMENT_CONTENT_MULT))) {
		    cur->c1->ocur = XML_ELEMENT_CONTENT_ONCE;
		    found = 1;
		}
		if ((cur->c2 != NULL) &&
	            ((cur->c2->ocur == XML_ELEMENT_CONTENT_OPT) ||
		     (cur->c2->ocur == XML_ELEMENT_CONTENT_MULT))) {
		    cur->c2->ocur = XML_ELEMENT_CONTENT_ONCE;
		    found = 1;
		}
		cur = cur->c2;
	    }
	    if (found)
		ret->ocur = XML_ELEMENT_CONTENT_MULT;
	}
	NEXT;
    }
    return(ret);
}